

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_rawDataResize(Context *context,IntrinsicResult partialResult)

{
  int32_t iVar1;
  String *msg;
  Value dataWrapper;
  Value self;
  Value v;
  Value local_60;
  String local_50;
  String local_40;
  String local_30;
  
  MiniScript::String::String(&local_30,"self");
  MiniScript::Context::GetVar((Context *)&self,(String *)partialResult.rs,(LocalOnlyMode)&local_30);
  MiniScript::String::release(&local_30);
  MiniScript::String::String(&local_40,"bytes");
  MiniScript::Context::GetVar((Context *)&v,(String *)partialResult.rs,(LocalOnlyMode)&local_40);
  iVar1 = MiniScript::Value::IntValue(&v);
  MiniScript::Value::~Value(&v);
  MiniScript::String::release(&local_40);
  if (iVar1 < 0) {
    MiniScript::String::String(&local_50,"bytes parameter must be >= 0");
    msg = &local_50;
    MiniScript::IndexException::IndexException((IndexException *)&v,msg);
    MiniScript::IndexException::raise((IndexException *)&v,(int)msg);
    MiniScript::MiniscriptException::~MiniscriptException((MiniscriptException *)&v);
    MiniScript::String::release(&local_50);
  }
  MiniScript::Value::Value(&local_60,&_handle);
  MiniScript::Value::Lookup(&dataWrapper,&self);
  MiniScript::Value::~Value(&local_60);
  if (dataWrapper.type != Handle) {
    v.data.ref = (RefCountedStorage *)operator_new(0x20);
    (v.data.ref)->refCount = 1;
    (v.data.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__RawDataHandleStorage_00166570;
    v.data.ref[1]._vptr_RefCountedStorage = (_func_int **)0x0;
    v.data.ref[1].refCount = 0;
    v.localOnly = Off;
    v.type = Handle;
    v.noInvoke = false;
    MiniScript::Value::operator=(&dataWrapper,&v);
    MiniScript::Value::~Value(&v);
    MiniScript::Value::GetDict((ValueDict *)&v,&self);
    MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&v,
               &_handle,&dataWrapper);
    MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::
    ~Dictionary((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&v);
  }
  RawDataHandleStorage::resize((RawDataHandleStorage *)dataWrapper.data.ref,(long)iVar1);
  MiniScript::IntrinsicResult::IntrinsicResult
            ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  MiniScript::Value::~Value(&dataWrapper);
  MiniScript::Value::~Value(&self);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_rawDataResize(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	long nBytes = context->GetVar("bytes").IntValue();
	if (nBytes < 0) {
		IndexException(String("bytes parameter must be >= 0")).raise();
	}
	Value dataWrapper = self.Lookup(_handle);
	if (dataWrapper.IsNull() or dataWrapper.type != ValueType::Handle) {
		dataWrapper = Value::NewHandle(new RawDataHandleStorage());
		self.GetDict().SetValue(_handle, dataWrapper);
	}
	RawDataHandleStorage *storage = (RawDataHandleStorage*)dataWrapper.data.ref;
	storage->resize(nBytes);
	return IntrinsicResult::Null;
}